

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3TokenizerFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Fts3Hash *pH;
  int iVar1;
  int iVar2;
  void *pKey;
  Fts3HashElem *pFVar3;
  undefined8 *puVar4;
  void *pvVar5;
  char *pcVar6;
  void *pPtr;
  int isEnabled;
  void *local_40;
  int local_34;
  
  local_40 = (void *)0x0;
  pH = (Fts3Hash *)context->pFunc->pUserData;
  pKey = sqlite3ValueText(*argv,'\x01');
  iVar1 = sqlite3ValueBytes(*argv,'\x01');
  if (argc != 2) {
    if (pKey != (void *)0x0) {
      pFVar3 = sqlite3Fts3HashFindElem(pH,pKey,iVar1 + 1);
      if (pFVar3 == (Fts3HashElem *)0x0) {
        local_40 = (void *)0x0;
      }
      else {
        local_40 = pFVar3->data;
      }
    }
    if (local_40 == (void *)0x0) {
      pcVar6 = sqlite3_mprintf("unknown tokenizer: %s",pKey);
      context->isError = 1;
      sqlite3VdbeMemSetStr(context->pOut,pcVar6,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
      ;
      sqlite3_free(pcVar6);
      return;
    }
    goto LAB_001b7f89;
  }
  local_34 = 0;
  sqlite3_db_config(context->pOut->db,0x3ec,0xffffffff,&local_34);
  if ((local_34 == 0) && ((argv[1]->flags & 0x20) == 0)) {
    context->isError = 1;
    sqlite3VdbeMemSetStr
              (context->pOut,"fts3tokenize disabled",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  iVar2 = sqlite3ValueBytes(argv[1],'\x01');
  if (iVar2 != 8 || pKey == (void *)0x0) {
    pcVar6 = "argument type mismatch";
LAB_001b7f53:
    context->isError = 1;
    sqlite3VdbeMemSetStr(context->pOut,pcVar6,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    puVar4 = (undefined8 *)sqlite3_value_blob(argv[1]);
    local_40 = (void *)*puVar4;
    pvVar5 = sqlite3Fts3HashInsert(pH,pKey,iVar1 + 1,local_40);
    if (pvVar5 == local_40) {
      pcVar6 = "out of memory";
      goto LAB_001b7f53;
    }
  }
  if (iVar2 != 8 || pKey == (void *)0x0) {
    return;
  }
LAB_001b7f89:
  local_34 = 0;
  sqlite3_db_config(context->pOut->db,0x3ec,0xffffffff);
  if ((local_34 != 0) || (((*argv)->flags & 0x20) != 0)) {
    setResultStrOrError(context,(char *)&local_40,8,'\0',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void fts3TokenizerFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  Fts3Hash *pHash;
  void *pPtr = 0;
  const unsigned char *zName;
  int nName;

  assert( argc==1 || argc==2 );

  pHash = (Fts3Hash *)sqlite3_user_data(context);

  zName = sqlite3_value_text(argv[0]);
  nName = sqlite3_value_bytes(argv[0])+1;

  if( argc==2 ){
    if( fts3TokenizerEnabled(context) || sqlite3_value_frombind(argv[1]) ){
      void *pOld;
      int n = sqlite3_value_bytes(argv[1]);
      if( zName==0 || n!=sizeof(pPtr) ){
        sqlite3_result_error(context, "argument type mismatch", -1);
        return;
      }
      pPtr = *(void **)sqlite3_value_blob(argv[1]);
      pOld = sqlite3Fts3HashInsert(pHash, (void *)zName, nName, pPtr);
      if( pOld==pPtr ){
        sqlite3_result_error(context, "out of memory", -1);
      }
    }else{
      sqlite3_result_error(context, "fts3tokenize disabled", -1);
      return;
    }
  }else{
    if( zName ){
      pPtr = sqlite3Fts3HashFind(pHash, zName, nName);
    }
    if( !pPtr ){
      char *zErr = sqlite3_mprintf("unknown tokenizer: %s", zName);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
  }
  if( fts3TokenizerEnabled(context) || sqlite3_value_frombind(argv[0]) ){
    sqlite3_result_blob(context, (void *)&pPtr, sizeof(pPtr), SQLITE_TRANSIENT);
  }
}